

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pluginlist.h
# Opt level: O2

void __thiscall ON_PlugInRef::~ON_PlugInRef(ON_PlugInRef *this)

{
  ON_wString::~ON_wString(&this->m_developer_fax);
  ON_wString::~ON_wString(&this->m_developer_updateurl);
  ON_wString::~ON_wString(&this->m_developer_website);
  ON_wString::~ON_wString(&this->m_developer_email);
  ON_wString::~ON_wString(&this->m_developer_phone);
  ON_wString::~ON_wString(&this->m_developer_country);
  ON_wString::~ON_wString(&this->m_developer_address);
  ON_wString::~ON_wString(&this->m_developer_organization);
  ON_wString::~ON_wString(&this->m_plugin_filename);
  ON_wString::~ON_wString(&this->m_plugin_version);
  ON_wString::~ON_wString(&this->m_plugin_name);
  return;
}

Assistant:

class ON_CLASS ON_PlugInRef
{
public:
  ON_PlugInRef();

  // executable information
  ON_UUID m_plugin_id;
  int m_plugin_type; // CRhinoPlugIn::plugin_type enum value
  int m_plugin_platform; // 0 = unknown, 1 = C++, 2 = .NET
  int m_plugin_sdk_version;
  int m_plugin_sdk_service_release;
  ON_wString m_plugin_name;
  ON_wString m_plugin_version;
  ON_wString m_plugin_filename; // name of executable file

  // developer contact information
  ON_wString m_developer_organization;
  ON_wString m_developer_address;
  ON_wString m_developer_country;
  ON_wString m_developer_phone;
  ON_wString m_developer_email;
  ON_wString m_developer_website;
  ON_wString m_developer_updateurl;
  ON_wString m_developer_fax;

  void Default();

  bool Write( ON_BinaryArchive& file ) const;
  bool Read( ON_BinaryArchive& file );

  void Dump(ON_TextLog& text_log) const;
}